

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsFrame.cpp
# Opt level: O0

void __thiscall KDReports::Frame::build(Frame *this,ReportBuilder *builder)

{
  AlignmentFlag horizontalAlignment;
  Element *element;
  bool bVar1;
  pointer pFVar2;
  QTextCursor *pQVar3;
  TextDocumentData *contentDocument;
  Report *report;
  qreal qVar4;
  QColor local_140;
  ElementData *local_130;
  ElementData *ed;
  const_iterator local_120;
  const_iterator __end1;
  const_iterator __begin1;
  add_const_t<QList<KDReports::ElementData>_> *__range1;
  ReportBuilder contentsBuilder;
  QTextCursor contentsCursor;
  QTextFrame *frame;
  QTextCursor *textDocCursor;
  QTextLength local_68;
  QTextLength local_58 [2];
  QTextLength local_38;
  QTextFrameFormat local_28 [8];
  QTextFrameFormat format;
  ReportBuilder *builder_local;
  Frame *this_local;
  
  QTextFrameFormat::QTextFrameFormat(local_28);
  pFVar2 = std::unique_ptr<KDReports::FramePrivate,_std::default_delete<KDReports::FramePrivate>_>::
           operator->(&this->d);
  if ((pFVar2->m_width != 0.0) || (NAN(pFVar2->m_width))) {
    pFVar2 = std::unique_ptr<KDReports::FramePrivate,_std::default_delete<KDReports::FramePrivate>_>
             ::operator->(&this->d);
    if (pFVar2->m_widthUnit == Millimeters) {
      pFVar2 = std::
               unique_ptr<KDReports::FramePrivate,_std::default_delete<KDReports::FramePrivate>_>::
               operator->(&this->d);
      qVar4 = mmToPixels(pFVar2->m_width);
      QTextLength::QTextLength(&local_38,FixedLength,qVar4);
      QTextFrameFormat::setWidth(local_28,&local_38);
    }
    else {
      pFVar2 = std::
               unique_ptr<KDReports::FramePrivate,_std::default_delete<KDReports::FramePrivate>_>::
               operator->(&this->d);
      QTextLength::QTextLength(local_58,PercentageLength,pFVar2->m_width);
      QTextFrameFormat::setWidth(local_28,local_58);
    }
  }
  pFVar2 = std::unique_ptr<KDReports::FramePrivate,_std::default_delete<KDReports::FramePrivate>_>::
           operator->(&this->d);
  if ((pFVar2->m_height != 0.0) || (NAN(pFVar2->m_height))) {
    pFVar2 = std::unique_ptr<KDReports::FramePrivate,_std::default_delete<KDReports::FramePrivate>_>
             ::operator->(&this->d);
    if (pFVar2->m_heightUnit == Millimeters) {
      pFVar2 = std::
               unique_ptr<KDReports::FramePrivate,_std::default_delete<KDReports::FramePrivate>_>::
               operator->(&this->d);
      qVar4 = mmToPixels(pFVar2->m_height);
      QTextLength::QTextLength(&local_68,FixedLength,qVar4);
      QTextFrameFormat::setHeight(local_28,&local_68);
    }
    else {
      pFVar2 = std::
               unique_ptr<KDReports::FramePrivate,_std::default_delete<KDReports::FramePrivate>_>::
               operator->(&this->d);
      QTextLength::QTextLength((QTextLength *)&textDocCursor,PercentageLength,pFVar2->m_height);
      QTextFrameFormat::setHeight(local_28,(QTextLength *)&textDocCursor);
    }
  }
  qVar4 = padding(this);
  qVar4 = mmToPixels(qVar4);
  QTextFrameFormat::setPadding(local_28,qVar4);
  pFVar2 = std::unique_ptr<KDReports::FramePrivate,_std::default_delete<KDReports::FramePrivate>_>::
           operator->(&this->d);
  QTextFrameFormat::setBorder(local_28,pFVar2->m_border);
  pFVar2 = std::unique_ptr<KDReports::FramePrivate,_std::default_delete<KDReports::FramePrivate>_>::
           operator->(&this->d);
  QTextFrameFormat::setPosition(local_28,pFVar2->m_position);
  pQVar3 = ReportBuilder::cursor(builder);
  QTextCursor::insertFrame((QTextFrameFormat *)pQVar3);
  QTextFrame::firstCursorPosition();
  contentDocument = ReportBuilder::currentDocumentData(builder);
  report = ReportBuilder::report(builder);
  ReportBuilder::ReportBuilder
            ((ReportBuilder *)&__range1,contentDocument,(QTextCursor *)&contentsBuilder.m_first,
             report);
  ReportBuilder::copyStateFrom((ReportBuilder *)&__range1,builder);
  pFVar2 = std::unique_ptr<KDReports::FramePrivate,_std::default_delete<KDReports::FramePrivate>_>::
           operator->(&this->d);
  __end1 = QList<KDReports::ElementData>::begin(&pFVar2->m_elements);
  local_120 = QList<KDReports::ElementData>::end(&pFVar2->m_elements);
  while( true ) {
    ed = local_120.i;
    bVar1 = QList<KDReports::ElementData>::const_iterator::operator!=(&__end1,local_120);
    if (!bVar1) break;
    local_130 = QList<KDReports::ElementData>::const_iterator::operator*(&__end1);
    switch(local_130->field_0x8 & 7) {
    case 0:
      ReportBuilder::addInlineElement((ReportBuilder *)&__range1,local_130->m_element);
      break;
    case 1:
      element = local_130->m_element;
      horizontalAlignment = (local_130->field_2).m_align;
      QColor::QColor(&local_140);
      ReportBuilder::addBlockElement
                ((ReportBuilder *)&__range1,element,horizontalAlignment,&local_140);
      break;
    case 2:
      ReportBuilder::addVariable((ReportBuilder *)&__range1,(local_130->field_2).m_variableType);
      break;
    case 3:
      ReportBuilder::addVerticalSpacing((ReportBuilder *)&__range1,(local_130->field_2).m_value);
    }
    QList<KDReports::ElementData>::const_iterator::operator++(&__end1);
  }
  QTextCursor::movePosition((MoveOperation)pQVar3,0xb,0);
  ReportBuilder::~ReportBuilder((ReportBuilder *)&__range1);
  QTextCursor::~QTextCursor((QTextCursor *)&contentsBuilder.m_first);
  QTextFrameFormat::~QTextFrameFormat(local_28);
  return;
}

Assistant:

void KDReports::Frame::build(ReportBuilder &builder) const
{
    // prepare the frame
    QTextFrameFormat format;
    if (d->m_width) {
        if (d->m_widthUnit == Millimeters) {
            format.setWidth(QTextLength(QTextLength::FixedLength, mmToPixels(d->m_width)));
        } else {
            format.setWidth(QTextLength(QTextLength::PercentageLength, d->m_width));
        }
    }
    if (d->m_height) {
        if (d->m_heightUnit == Millimeters) {
            format.setHeight(QTextLength(QTextLength::FixedLength, mmToPixels(d->m_height)));
        } else {
            format.setHeight(QTextLength(QTextLength::PercentageLength, d->m_height));
        }
    }

    format.setPadding(mmToPixels(padding()));
    format.setBorder(d->m_border);
    // TODO borderBrush like in AbstractTableElement
    format.setPosition(static_cast<QTextFrameFormat::Position>(d->m_position)); // those enums have the same value

    QTextCursor &textDocCursor = builder.cursor();

    QTextFrame *frame = textDocCursor.insertFrame(format);

    QTextCursor contentsCursor = frame->firstCursorPosition();

    ReportBuilder contentsBuilder(builder.currentDocumentData(), contentsCursor, builder.report());
    contentsBuilder.copyStateFrom(builder);

    for (const KDReports::ElementData &ed : std::as_const(d->m_elements)) {
        switch (ed.m_type) {
        case KDReports::ElementData::Inline:
            contentsBuilder.addInlineElement(*ed.m_element);
            break;
        case KDReports::ElementData::Block:
            contentsBuilder.addBlockElement(*ed.m_element, ed.m_align);
            break;
        case KDReports::ElementData::Variable:
            contentsBuilder.addVariable(ed.m_variableType);
            break;
        case KDReports::ElementData::VerticalSpacing:
            contentsBuilder.addVerticalSpacing(ed.m_value);
            break;
        }
    }

    textDocCursor.movePosition(QTextCursor::End);
}